

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  MdParser *this;
  NcursesDisplayDriver *this_00;
  undefined8 uVar2;
  string driver_string;
  string local_2a8;
  MdlOptions op;
  ofstream output_file;
  
  setlocale(6,"");
  MdlOptions::MdlOptions(&op,argc,argv);
  this = (MdParser *)operator_new(0x238);
  MdlOptions::input_file_abi_cxx11_((string *)&output_file,&op);
  MdParser::MdParser(this,(string *)&output_file);
  std::__cxx11::string::~string((string *)&output_file);
  std::ofstream::ofstream(&output_file);
  MdlOptions::display_driver_abi_cxx11_(&driver_string,&op);
  bVar1 = std::operator==(&driver_string,"plain");
  if (bVar1) {
    this_00 = (NcursesDisplayDriver *)operator_new(0x10);
    PlainTextDisplayDriver::PlainTextDisplayDriver((PlainTextDisplayDriver *)this_00);
  }
  else {
    bVar1 = std::operator==(&driver_string,"ncurses");
    if (bVar1) {
      this_00 = (NcursesDisplayDriver *)operator_new(0x40);
      NcursesDisplayDriver::NcursesDisplayDriver(this_00);
    }
    else {
      bVar1 = std::operator==(&driver_string,"latex");
      if (bVar1) {
        this_00 = (NcursesDisplayDriver *)operator_new(0x10);
        LaTeXDisplayDriver::LaTeXDisplayDriver((LaTeXDisplayDriver *)this_00,true);
      }
      else {
        bVar1 = std::operator==(&driver_string,"html");
        if (bVar1) {
          this_00 = (NcursesDisplayDriver *)operator_new(0x10);
          HtmlDisplayDriver::HtmlDisplayDriver((HtmlDisplayDriver *)this_00,true);
        }
        else {
          bVar1 = std::operator==(&driver_string,"troff");
          if (bVar1) {
            this_00 = (NcursesDisplayDriver *)operator_new(0x10);
            TroffDisplayDriver::TroffDisplayDriver((TroffDisplayDriver *)this_00,true);
          }
          else {
            bVar1 = std::operator==(&driver_string,"ansi");
            if (bVar1) {
              this_00 = (NcursesDisplayDriver *)operator_new(0x10);
              AnsiDisplayDriver::AnsiDisplayDriver((AnsiDisplayDriver *)this_00);
            }
            else {
              bVar1 = std::operator==(&driver_string,"md");
              if (bVar1) {
                this_00 = (NcursesDisplayDriver *)operator_new(0x10);
                MdDisplayDriver::MdDisplayDriver((MdDisplayDriver *)this_00);
              }
              else {
                bVar1 = std::operator==(&driver_string,"rst");
                if (!bVar1) {
                  __assert_fail("driver",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/dopsi[P]mdl/mdl/main.cpp"
                                ,0x2c,"int main(int, char **)");
                }
                this_00 = (NcursesDisplayDriver *)operator_new(0x10);
                RstDisplayDriver::RstDisplayDriver((RstDisplayDriver *)this_00);
              }
            }
          }
        }
      }
    }
  }
  MdlOptions::output_file_abi_cxx11_(&local_2a8,&op);
  std::__cxx11::string::~string((string *)&local_2a8);
  if (local_2a8._M_string_length == 0) {
    uVar2 = (**(code **)(*(long *)this + 0x10))(this);
    (**(code **)(*(long *)this_00 + 0x10))(this_00,uVar2);
  }
  else {
    MdlOptions::output_file_abi_cxx11_(&local_2a8,&op);
    std::ofstream::open((string *)&output_file,(_Ios_Openmode)&local_2a8);
    std::__cxx11::string::~string((string *)&local_2a8);
    uVar2 = (**(code **)(*(long *)this + 0x10))(this);
    (**(code **)(*(long *)this_00 + 0x18))(this_00,uVar2,&output_file);
    std::ofstream::close();
  }
  (**(code **)(*(long *)this_00 + 8))(this_00);
  (**(code **)(*(long *)this + 8))(this);
  std::__cxx11::string::~string((string *)&driver_string);
  std::ofstream::~ofstream(&output_file);
  MdlOptions::~MdlOptions(&op);
  return 0;
}

Assistant:

int main(int argc, char ** argv) {
	setlocale(LC_ALL, "");

	MdlOptions op(argc, argv);
	Parser *parser(new MdParser(op.input_file()));
	DisplayDriver *driver(nullptr);
	ofstream output_file;

	string driver_string(op.display_driver());
	if (driver_string == "plain") {
		driver = new PlainTextDisplayDriver();
	} else if (driver_string == "ncurses") {
		driver = new NcursesDisplayDriver();
	} else if (driver_string == "latex") {
		driver = new LaTeXDisplayDriver(true);
	} else if (driver_string == "html") {
		driver = new HtmlDisplayDriver(true);
	} else if (driver_string == "troff") {
		driver = new TroffDisplayDriver(true);
	} else if (driver_string == "ansi") {
		driver = new AnsiDisplayDriver();
	} else if (driver_string == "md") {
		driver = new MdDisplayDriver();
	} else if (driver_string == "rst") {
		driver = new RstDisplayDriver();
	}

	assert(driver);
	assert(parser);
	
	/*
	 * This code section is not used since there is only one parser at the moment.
	 *
	if (vm.count("input-parser")) {
		// Select parser
	} else {
		// Default: MD
	}*/

	if (!op.output_file().empty()) {
		output_file.open(op.output_file());
		driver->display(parser->get_document(), output_file);
		output_file.close();
	} else {
		driver->display(parser->get_document());
	}

	delete driver;
	delete parser;

	return 0;
}